

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Literals * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::callExport
          (Literals *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Name name,
          Literals *arguments)

{
  Name name_00;
  Export *pEVar1;
  variant<wasm::Name,_wasm::HeapType> *pvVar2;
  SmallVector<wasm::Literal,_1UL> local_70;
  SmallVector<wasm::Literal,_1UL> *local_38;
  
  local_38 = &arguments->super_SmallVector<wasm::Literal,_1UL>;
  pEVar1 = Module::getExportOrNull(this->wasm,name);
  if ((pEVar1 == (Export *)0x0) || (pEVar1->kind != Function)) {
    (*this->externalInterface->_vptr_ExternalInterface[8])
              (this->externalInterface,"callExport not found");
  }
  pvVar2 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
  if ((pEVar1->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_index == '\0') {
    pvVar2 = &pEVar1->value;
  }
  name_00.super_IString.str =
       *(IString *)
        &(pvVar2->super__Variant_base<wasm::Name,_wasm::HeapType>).
         super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
         super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
         super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
         super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
         super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u;
  SmallVector<wasm::Literal,_1UL>::SmallVector(&local_70,local_38);
  callFunction(__return_storage_ptr__,this,name_00,(Literals *)&local_70);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_70.flexible);
  Literal::~Literal(local_70.fixed._M_elems);
  return __return_storage_ptr__;
}

Assistant:

Literals callExport(Name name, const Literals& arguments) {
    Export* export_ = wasm.getExportOrNull(name);
    if (!export_ || export_->kind != ExternalKind::Function) {
      externalInterface->trap("callExport not found");
    }
    return callFunction(*export_->getInternalName(), arguments);
  }